

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

Token * __thiscall wabt::WastLexer::GetKeywordToken(Token *__return_storage_ptr__,WastLexer *this)

{
  Location loc;
  Location loc_00;
  bool bVar1;
  Location local_60;
  Type local_40;
  Location local_38;
  TokenInfo *local_18;
  TokenInfo *info;
  WastLexer *this_local;
  
  info = (TokenInfo *)this;
  ReadReservedChars(this);
  local_18 = anon_unknown_8::Perfect_Hash::InWordSet
                       (this->token_start_,(long)this->cursor_ - (long)this->token_start_);
  if (local_18 == (TokenInfo *)0x0) {
    TextToken(__return_storage_ptr__,this,Reserved,0);
  }
  else {
    bVar1 = IsTokenTypeBare(local_18->token_type);
    if (bVar1) {
      BareToken(__return_storage_ptr__,this,local_18->token_type);
    }
    else {
      bVar1 = IsTokenTypeType(local_18->token_type);
      if ((!bVar1) && (bVar1 = IsTokenTypeRefKind(local_18->token_type), !bVar1)) {
        bVar1 = IsTokenTypeOpcode(local_18->token_type);
        if (bVar1) {
          GetLocation(&local_60,this);
          loc_00.filename._M_str = local_60.filename._M_str;
          loc_00.filename._M_len = local_60.filename._M_len;
          loc_00.field_1.field_1.offset = local_60.field_1.field_1.offset;
          loc_00.field_1._8_8_ = local_60.field_1._8_8_;
          Token::Token(__return_storage_ptr__,loc_00,local_18->token_type,
                       (Opcode)(local_18->field_2).opcode.enum_);
          return __return_storage_ptr__;
        }
        __assert_fail("IsTokenTypeOpcode(info->token_type)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-lexer.cc"
                      ,0x271,"Token wabt::WastLexer::GetKeywordToken()");
      }
      GetLocation(&local_38,this);
      local_40 = (local_18->field_2).value_type;
      loc.filename._M_str = local_38.filename._M_str;
      loc.filename._M_len = local_38.filename._M_len;
      loc.field_1.field_1.offset = local_38.field_1.field_1.offset;
      loc.field_1._8_8_ = local_38.field_1._8_8_;
      Token::Token(__return_storage_ptr__,loc,local_18->token_type,local_40);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetKeywordToken() {
  ReadReservedChars();
  TokenInfo* info =
      Perfect_Hash::InWordSet(token_start_, cursor_ - token_start_);
  if (!info) {
    return TextToken(TokenType::Reserved);
  }
  if (IsTokenTypeBare(info->token_type)) {
    return BareToken(info->token_type);
  } else if (IsTokenTypeType(info->token_type) ||
             IsTokenTypeRefKind(info->token_type)) {
    return Token(GetLocation(), info->token_type, info->value_type);
  } else {
    assert(IsTokenTypeOpcode(info->token_type));
    return Token(GetLocation(), info->token_type, info->opcode);
  }
}